

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_lib.cc
# Opt level: O3

int SSL_CTX_set1_tls_channel_id(SSL_CTX *ctx,EVP_PKEY *private_key)

{
  int iVar1;
  pointer __p;
  __uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter> local_20;
  
  iVar1 = is_p256_key(private_key);
  if (iVar1 == 0) {
    iVar1 = 0;
    ERR_put_error(0x10,0,0x80,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_lib.cc"
                  ,0x927);
  }
  else {
    if (private_key != (EVP_PKEY *)0x0) {
      EVP_PKEY_up_ref(private_key);
    }
    local_20._M_t.super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
    super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl =
         (tuple<evp_pkey_st_*,_bssl::internal::Deleter>)
         (_Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>)0x0;
    std::__uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>::reset
              ((__uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter> *)&ctx->channel_id_private,
               private_key);
    std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::~unique_ptr
              ((unique_ptr<evp_pkey_st,_bssl::internal::Deleter> *)&local_20);
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

int SSL_CTX_set1_tls_channel_id(SSL_CTX *ctx, EVP_PKEY *private_key) {
  if (!is_p256_key(private_key)) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_CHANNEL_ID_NOT_P256);
    return 0;
  }

  ctx->channel_id_private = UpRef(private_key);
  return 1;
}